

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::Document::parseTAGDirective(Document *this)

{
  undefined8 uVar1;
  char *pcVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  ulong uVar6;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Chars_01;
  StringRef Chars_02;
  undefined1 local_90 [8];
  Token Tag;
  undefined1 local_48 [8];
  StringRef TagHandle;
  
  Scanner::getNext((Token *)local_90,
                   (Scanner *)
                   (this->stream->scanner)._M_t.
                   super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                   .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
  TagHandle.Length = Tag._0_8_;
  Chars.Length = 2;
  Chars.Data = " \t";
  pcVar2 = (char *)StringRef::find_first_of((StringRef *)&TagHandle.Length,Chars,0);
  if (Tag.Range.Data < pcVar2) {
    pcVar2 = Tag.Range.Data;
  }
  TagHandle.Data = Tag.Range.Data + -(long)pcVar2;
  local_48 = (undefined1  [8])(pcVar2 + TagHandle.Length);
  Chars_00.Length = 2;
  Chars_00.Data = " \t";
  pcVar2 = (char *)StringRef::find_first_not_of((StringRef *)local_48,Chars_00,0);
  if (TagHandle.Data <= pcVar2) {
    pcVar2 = TagHandle.Data;
  }
  pcVar5 = TagHandle.Data + -(long)pcVar2;
  TagHandle.Length = (size_t)(pcVar2 + (long)local_48);
  Chars_01.Length = 2;
  Chars_01.Data = " \t";
  TagHandle.Data = (char *)StringRef::find_first_of((StringRef *)&TagHandle.Length,Chars_01,0);
  if (pcVar5 < TagHandle.Data) {
    TagHandle.Data = pcVar5;
  }
  local_48 = (undefined1  [8])TagHandle.Length;
  Tag.Value.field_2._8_8_ = TagHandle.Data + TagHandle.Length;
  uVar6 = (long)pcVar5 - (long)TagHandle.Data;
  Chars_02.Length = 2;
  Chars_02.Data = " \t";
  sVar3 = StringRef::find_first_not_of((StringRef *)((long)&Tag.Value.field_2 + 8),Chars_02,0);
  uVar1 = Tag.Value.field_2._8_8_;
  pmVar4 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,(key_type *)local_48);
  if (uVar6 <= sVar3) {
    sVar3 = uVar6;
  }
  pmVar4->Data = (char *)(uVar1 + sVar3);
  pmVar4->Length = uVar6 - sVar3;
  if ((size_type *)Tag.Range.Length != &Tag.Value._M_string_length) {
    operator_delete((void *)Tag.Range.Length,Tag.Value._M_string_length + 1);
  }
  return;
}

Assistant:

void Document::parseTAGDirective() {
  Token Tag = getNext(); // %TAG <handle> <prefix>
  StringRef T = Tag.Range;
  // Strip %TAG
  T = T.substr(T.find_first_of(" \t")).ltrim(" \t");
  std::size_t HandleEnd = T.find_first_of(" \t");
  StringRef TagHandle = T.substr(0, HandleEnd);
  StringRef TagPrefix = T.substr(HandleEnd).ltrim(" \t");
  TagMap[TagHandle] = TagPrefix;
}